

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# araplanner.cpp
# Opt level: O1

int __thiscall ARAPlanner::force_planning_from_scratch_and_free_memory(ARAPlanner *this)

{
  CMDPSTATE *pCVar1;
  DiscreteSpaceInformation *pDVar2;
  pointer ppiVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  
  pCVar1 = this->pSearchStateSpace_->searchstartstate;
  uVar9 = 0xffffffff;
  uVar6 = 0xffffffff;
  if (pCVar1 != (CMDPSTATE *)0x0) {
    uVar6 = pCVar1->StateID;
  }
  pCVar1 = this->pSearchStateSpace_->searchgoalstate;
  if (pCVar1 != (CMDPSTATE *)0x0) {
    uVar9 = pCVar1->StateID;
  }
  uVar5 = uVar9;
  if (this->bforwardsearch != false) {
    uVar5 = uVar6;
    uVar6 = uVar9;
  }
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x27])(this);
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x26])(this,this->pSearchStateSpace_);
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x2b])(this,this->pSearchStateSpace_);
  pDVar2 = (this->super_SBPLPlanner).environment_;
  ppiVar3 = (pDVar2->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  lVar7 = (long)(pDVar2->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppiVar3;
  if (lVar7 != 0) {
    uVar8 = 0;
    do {
      piVar4 = ppiVar3[uVar8];
      piVar4[0] = -1;
      piVar4[1] = -1;
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < (ulong)(lVar7 >> 3));
  }
  if (-1 < (int)uVar5) {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[5])(this,(ulong)uVar5);
  }
  if (-1 < (int)uVar6) {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[4])(this,(ulong)uVar6);
  }
  return 1;
}

Assistant:

int ARAPlanner::force_planning_from_scratch_and_free_memory()
{
    SBPL_PRINTF("planner: forceplanfromscratch set\n");
    int start_id = -1;
    int goal_id = -1;
    if (pSearchStateSpace_->searchstartstate)
        start_id = pSearchStateSpace_->searchstartstate->StateID;
    if (pSearchStateSpace_->searchgoalstate)
        goal_id = pSearchStateSpace_->searchgoalstate->StateID;

    if (!bforwardsearch) {
        int temp = start_id;
        start_id = goal_id;
        goal_id = temp;
    }

    DeleteSearchStateSpace(pSearchStateSpace_);
    CreateSearchStateSpace(pSearchStateSpace_);
    InitializeSearchStateSpace(pSearchStateSpace_);
    for (unsigned int i = 0; i < environment_->StateID2IndexMapping.size(); i++)
        for (int j = 0; j < NUMOFINDICES_STATEID2IND; j++)
            environment_->StateID2IndexMapping[i][j] = -1;

    if (start_id >= 0)
        set_start(start_id);
    if (goal_id >= 0)
        set_goal(goal_id);
    return 1;
}